

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

bool absl::lts_20250127::anon_unknown_74::IsSubcordInCordAt
               (CharIterator haystack,CharIterator needle_begin,CharIterator needle_end)

{
  CordRepBtree *pCVar1;
  char *pcVar2;
  CordRepBtree *pCVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  int iVar6;
  size_type __rlen;
  CordRepBtree *__n;
  bool bVar7;
  CordRepBtree *in_stack_00000008;
  char *in_stack_00000010;
  CordRepBtree *in_stack_00000020;
  int in_stack_00000030;
  
  while (pCVar5 = haystack.chunk_iterator_.btree_reader_.navigator_.node_[6],
        pCVar4 = haystack.chunk_iterator_.btree_reader_.navigator_.node_[3],
        pCVar3 = in_stack_00000020, pcVar2 = in_stack_00000010, pCVar1 = in_stack_00000008,
        haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] !=
        needle_begin.chunk_iterator_.btree_reader_.navigator_.node_[6]) {
    if (in_stack_00000020 == (CordRepBtree *)0x0) {
      _GLOBAL__N_1::IsSubcordInCordAt();
LAB_0029e9d9:
      _GLOBAL__N_1::IsSubcordInCordAt();
LAB_0029e9de:
      __assert_fail("bytes_remaining_ >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
    }
    if (in_stack_00000008 == (CordRepBtree *)0x0) {
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x50f,
                    "bool absl::lts_20250127::(anonymous namespace)::IsSubcordInCordAt(absl::Cord::CharIterator, absl::Cord::CharIterator, absl::Cord::CharIterator)"
                   );
    }
    if (haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] == (CordRepBtree *)0x0)
    goto LAB_0029e9d9;
    __n = in_stack_00000008;
    if (haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] < in_stack_00000008) {
      __n = haystack.chunk_iterator_.btree_reader_.navigator_.node_[3];
    }
    if (haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] == (CordRepBtree *)0x0) {
      bVar7 = false;
    }
    else {
      iVar6 = bcmp(in_stack_00000010,haystack.chunk_iterator_.btree_reader_.navigator_.node_[4],
                   (size_t)__n);
      bVar7 = iVar6 != 0;
    }
    if (bVar7) break;
    if (pCVar3 < __n) goto LAB_0029e9de;
    if (pCVar4 < pCVar1) {
      in_stack_00000010 = pcVar2 + (long)__n;
      in_stack_00000008 = (CordRepBtree *)((long)pCVar1 - (long)__n);
      in_stack_00000020 = (CordRepBtree *)((long)pCVar3 - (long)__n);
    }
    else if (pCVar4 != (CordRepBtree *)0x0) {
      if (((long)in_stack_00000030 < 0) ||
         (*(long *)(haystack.chunk_iterator_.btree_reader_.navigator_.index_ +
                   (long)in_stack_00000030 * 8 + -0x3c) == 0)) {
        in_stack_00000020 = (CordRepBtree *)0x0;
      }
      else {
        Cord::ChunkIterator::AdvanceBytesBtree((ChunkIterator *)&stack0x00000008,(size_t)__n);
      }
    }
    if (haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] < __n) goto LAB_0029e9de;
    if (haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] < __n ||
        (CordRepBtree *)
        ((long)haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] - (long)__n) ==
        (CordRepBtree *)0x0) {
      if (pCVar4 != (CordRepBtree *)0x0) {
        if (((long)(int)haystack.chunk_iterator_.btree_reader_.navigator_.node_[8] < 0) ||
           (*(long *)(needle_begin.chunk_iterator_.btree_reader_.navigator_.index_ +
                     (long)(int)haystack.chunk_iterator_.btree_reader_.navigator_.node_[8] * 8 +
                     -0x3c) == 0)) {
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] = (CordRepBtree *)0x0;
        }
        else {
          Cord::ChunkIterator::AdvanceBytesBtree
                    ((ChunkIterator *)(haystack.chunk_iterator_.btree_reader_.navigator_.node_ + 3),
                     (size_t)__n);
        }
      }
    }
    else {
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[4] =
           (CordRepBtree *)
           ((haystack.chunk_iterator_.btree_reader_.navigator_.node_[4]->super_CordRep).storage +
           (long)((__n->super_CordRep).storage + -0x1a));
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] =
           (CordRepBtree *)
           ((long)haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] - (long)__n);
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] =
           (CordRepBtree *)
           ((long)haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] - (long)__n);
    }
  }
  return pCVar5 == needle_begin.chunk_iterator_.btree_reader_.navigator_.node_[6];
}

Assistant:

bool IsSubcordInCordAt(absl::Cord::CharIterator haystack,
                       absl::Cord::CharIterator needle_begin,
                       absl::Cord::CharIterator needle_end) {
  while (needle_begin != needle_end) {
    auto haystack_chunk = absl::Cord::ChunkRemaining(haystack);
    assert(!haystack_chunk.empty());
    auto needle_chunk = absl::Cord::ChunkRemaining(needle_begin);
    auto min_length = std::min(haystack_chunk.size(), needle_chunk.size());
    if (haystack_chunk.substr(0, min_length) !=
        needle_chunk.substr(0, min_length)) {
      return false;
    }
    absl::Cord::Advance(&haystack, min_length);
    absl::Cord::Advance(&needle_begin, min_length);
  }
  return true;
}